

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *environment_00;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  size_t argumentCount_00;
  size_t local_1a0;
  size_t i;
  size_t applicationArgumentCount;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  undefined1 auStack_b8 [7];
  _Bool isMacro;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_56_7_e267023e gcFrame;
  sysbvm_astUnexpandedApplicationNode_t **unexpandedNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  environment_00 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x38);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  _auStack_b8 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),*environment_00);
  sVar1 = sysbvm_tuple_getType(context,(sysbvm_tuple_t)gcFrameRecord.roots);
  sVar2 = sysbvm_tuple_getType(context,sVar1);
  sVar2 = sysbvm_type_getAnalyzeAndEvaluateUnexpandedApplicationNodeOfWithEnvironmentFunction
                    (context,sVar2);
  if (sVar2 == 0) {
    callFrameStack.gcRoots.applicationArguments[0xf]._7_1_ =
         sysbvm_function_isMacro(context,(sysbvm_tuple_t)gcFrameRecord.roots);
    if ((bool)callFrameStack.gcRoots.applicationArguments[0xf]._7_1_) {
      sVar1 = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro
                        (context,arguments,(sysbvm_tuple_t *)&gcFrameRecord.roots,environment_00);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      context_local =
           (sysbvm_context_t *)
           sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sVar1,*environment_00);
    }
    else {
      memset(&callFrameStackRecord.roots,0,0xb0);
      memset(&applicationArgumentCount,0,0x20);
      callFrameStackRecord.previous._0_4_ = 0;
      callFrameStackRecord.type = 0x11;
      callFrameStackRecord._12_4_ = 0;
      callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
      sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
      argumentCount_00 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x30));
      sysbvm_functionCallFrameStack_begin
                (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,
                 (sysbvm_tuple_t)gcFrameRecord.roots,argumentCount_00,0);
      for (local_1a0 = 0; local_1a0 < argumentCount_00; local_1a0 = local_1a0 + 1) {
        sVar1 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),local_1a0);
        sVar1 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                          (context,sVar1,*environment_00);
        sysbvm_functionCallFrameStack_push
                  ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,sVar1);
      }
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      context_local =
           (sysbvm_context_t *)
           sysbvm_functionCallFrameStack_finish
                     (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
    }
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_function_apply4
                   (context,sVar2,sVar1,*arguments,(sysbvm_tuple_t)gcFrameRecord.roots,
                    *environment_00);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedApplicationNode_t **unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t**)node;

    struct {
        sysbvm_tuple_t functionOrMacro;
        sysbvm_tuple_t functionOrMacroExpressionType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedNode)->super.sourcePosition);

    gcFrame.functionOrMacro = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*unexpandedNode)->functionOrMacroExpression, *environment);
    gcFrame.functionOrMacroExpressionType = sysbvm_tuple_getType(context, gcFrame.functionOrMacro);
    gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndEvaluateUnexpandedApplicationNodeOfWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.functionOrMacroExpressionType));
    if(gcFrame.analysisFunction)
    {
        gcFrame.result = sysbvm_function_apply4(context, gcFrame.analysisFunction, gcFrame.functionOrMacroExpressionType, (sysbvm_tuple_t)*unexpandedNode, gcFrame.functionOrMacro, *environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }

    bool isMacro = sysbvm_function_isMacro(context, gcFrame.functionOrMacro);
    if(isMacro)
    {
        gcFrame.expansionResult = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro(context, node, &gcFrame.functionOrMacro, environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    size_t applicationArgumentCount = sysbvm_array_getSize((*unexpandedNode)->arguments);
    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.functionOrMacro, applicationArgumentCount, 0);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*unexpandedNode)->arguments, i);
        gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
    }

    //SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}